

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O2

Rule * slang::ast::RandSeqProductionSymbol::createRule
                 (Rule *__return_storage_ptr__,RsRuleSyntax *syntax,ASTContext *context,
                 StatementBlockSymbol *ruleBlock)

{
  RsWeightClauseSyntax *pRVar1;
  RandJoinClauseSyntax *pRVar2;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::StatementBlockSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::StatementBlockSymbol>,_(std::ranges::subrange_kind)0>
  sVar3;
  bool bVar4;
  int iVar5;
  Rule *pRVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Diagnostic *diag;
  undefined4 extraout_var_01;
  specific_symbol_iterator<slang::ast::StatementBlockSymbol> extraout_RDX;
  specific_symbol_iterator<slang::ast::StatementBlockSymbol> extraout_RDX_00;
  specific_symbol_iterator<slang::ast::StatementBlockSymbol> extraout_RDX_01;
  specific_symbol_iterator<slang::ast::StatementBlockSymbol> extraout_RDX_02;
  specific_symbol_iterator<slang::ast::StatementBlockSymbol> extraout_RDX_03;
  specific_symbol_iterator<slang::ast::StatementBlockSymbol> extraout_RDX_04;
  size_t extraout_RDX_05;
  bool bVar7;
  Compilation *dst;
  RsIfElseSyntax *ries;
  Expression *this;
  specific_symbol_iterator<slang::ast::StatementBlockSymbol> blockIt;
  optional<slang::ast::RandSeqProductionSymbol::ProdItem> elseItem;
  ProdItem ifItem;
  SmallVector<const_slang::ast::RandSeqProductionSymbol::ProdBase_*,_5UL> prods;
  specific_symbol_iterator<slang::ast::StatementBlockSymbol> local_110;
  StatementContext local_108;
  StatementBlockSymbol *local_d8;
  StatementBlockSymbol *local_d0;
  Rule *local_c8;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::StatementBlockSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::StatementBlockSymbol>,_(std::ranges::subrange_kind)0>
  local_c0;
  specific_symbol_iterator<slang::ast::StatementBlockSymbol> local_b0 [8];
  SmallVectorBase<const_slang::ast::RandSeqProductionSymbol::ProdBase_*> local_70 [2];
  Expression *expr;
  
  local_d0 = ruleBlock;
  local_c8 = __return_storage_ptr__;
  local_c0 = Scope::membersOfType<slang::ast::StatementBlockSymbol>(&ruleBlock->super_Scope);
  local_110 = local_c0._M_begin.current;
  dst = ((context->scope).ptr)->compilation;
  local_70[0].data_ = (pointer)local_70[0].firstElement;
  local_70[0].len = 0;
  local_70[0].cap = 5;
  local_c0._M_begin.current = local_110.current;
  if (((syntax->prods).super_span<slang::syntax::RsProdSyntax_*,_18446744073709551615UL>._M_extent.
       _M_extent_value & 0x1fffffffffffffff) != 0) {
    pRVar6 = (Rule *)(*(code *)(&DAT_00422108 +
                               *(int *)(&DAT_00422108 +
                                       (ulong)(((*(syntax->prods).
                                                  super_span<slang::syntax::RsProdSyntax_*,_18446744073709551615UL>
                                                  ._M_ptr)->super_SyntaxNode).kind - RsCase) * 4)))
                               ();
    return pRVar6;
  }
  pRVar1 = syntax->weightClause;
  if (pRVar1 == (RsWeightClauseSyntax *)0x0) {
    bVar7 = false;
    expr = (Expression *)0x0;
    sVar3 = local_c0;
  }
  else {
    iVar5 = Expression::bind((int)(pRVar1->weight).ptr,(sockaddr *)context,0);
    expr = (Expression *)CONCAT44(extraout_var,iVar5);
    ASTContext::requireIntegral(context,expr);
    sVar3._M_end.current = extraout_RDX.current;
    sVar3._M_begin.current = local_110.current;
    if (pRVar1->codeBlock == (RsProdSyntax *)0x0) {
      bVar7 = false;
    }
    else {
      bVar7 = true;
      local_d8 = (StatementBlockSymbol *)local_110.current;
      Scope::specific_symbol_iterator<slang::ast::StatementBlockSymbol>::increment(&local_110);
      sVar3._M_end.current = extraout_RDX_00.current;
      sVar3._M_begin.current = local_110.current;
    }
  }
  local_110 = sVar3._M_begin.current;
  pRVar2 = syntax->randJoin;
  if ((pRVar2 == (RandJoinClauseSyntax *)0x0) ||
     (pRVar2->expr == (ParenthesizedExpressionSyntax *)0x0)) {
    this = (Expression *)0x0;
  }
  else {
    iVar5 = Expression::bind((int)pRVar2->expr,(sockaddr *)context,0);
    this = (Expression *)CONCAT44(extraout_var_00,iVar5);
    bVar4 = Expression::bad(this);
    sVar3._M_end.current = extraout_RDX_01.current;
    sVar3._M_begin.current = local_110.current;
    if (!bVar4) {
      bVar4 = Type::isNumeric((this->type).ptr);
      sVar3._M_end.current = extraout_RDX_02.current;
      sVar3._M_begin.current = local_110.current;
      if (!bVar4) {
        diag = ASTContext::addDiag(context,(DiagCode)0xb40006,this->sourceRange);
        ast::operator<<(diag,(this->type).ptr);
        sVar3._M_end.current = extraout_RDX_03.current;
        sVar3._M_begin.current = local_110.current;
      }
    }
  }
  local_b0[0].current = local_c0._M_begin.current;
  while (local_110 = sVar3._M_begin.current, local_b0[0].current != local_c0._M_end.current) {
    local_108.lastEventControl.startLoc = (SourceLocation)0x0;
    local_108.lastEventControl.endLoc = (SourceLocation)0x0;
    local_108.blocks._M_ptr = (pointer)0x0;
    local_108.blocks._M_extent._M_extent_value = 0;
    local_108.flags.m_bits = 4;
    local_108.rootAstContext = context;
    StatementBlockSymbol::getStatement
              ((StatementBlockSymbol *)local_b0[0].current,context,&local_108);
    Statement::StatementContext::~StatementContext(&local_108);
    Scope::specific_symbol_iterator<slang::ast::StatementBlockSymbol>::increment(local_b0);
    sVar3._M_end.current = extraout_RDX_04.current;
    sVar3._M_begin.current = local_110.current;
  }
  iVar5 = SmallVectorBase<const_slang::ast::RandSeqProductionSymbol::ProdBase_*>::copy
                    (local_70,(EVP_PKEY_CTX *)dst,(EVP_PKEY_CTX *)sVar3._M_end.current.current);
  pRVar6 = local_c8;
  (local_c8->ruleBlock).ptr = local_d0;
  (local_c8->prods)._M_ptr = (pointer)CONCAT44(extraout_var_01,iVar5);
  (local_c8->prods)._M_extent._M_extent_value = extraout_RDX_05;
  local_c8->weightExpr = expr;
  local_c8->randJoinExpr = this;
  (local_c8->codeBlock).
  super__Optional_base<slang::ast::RandSeqProductionSymbol::CodeBlockProd,_true,_true>._M_payload.
  super__Optional_payload_base<slang::ast::RandSeqProductionSymbol::CodeBlockProd>._M_payload.
  _M_value.super_ProdBase.kind = CodeBlock;
  (local_c8->codeBlock).
  super__Optional_base<slang::ast::RandSeqProductionSymbol::CodeBlockProd,_true,_true>._M_payload.
  super__Optional_payload_base<slang::ast::RandSeqProductionSymbol::CodeBlockProd>._M_payload.
  _M_value.block.ptr = local_d8;
  (local_c8->codeBlock).
  super__Optional_base<slang::ast::RandSeqProductionSymbol::CodeBlockProd,_true,_true>._M_payload.
  super__Optional_payload_base<slang::ast::RandSeqProductionSymbol::CodeBlockProd>._M_engaged =
       bVar7;
  local_c8->isRandJoin = pRVar2 != (RandJoinClauseSyntax *)0x0;
  SmallVectorBase<const_slang::ast::RandSeqProductionSymbol::ProdBase_*>::cleanup
            (local_70,(EVP_PKEY_CTX *)dst);
  return pRVar6;
}

Assistant:

RandSeqProductionSymbol::Rule RandSeqProductionSymbol::createRule(
    const RsRuleSyntax& syntax, const ASTContext& context, const StatementBlockSymbol& ruleBlock) {

    auto blockRange = ruleBlock.membersOfType<StatementBlockSymbol>();
    auto blockIt = blockRange.begin();

    auto& comp = context.getCompilation();
    SmallVector<const ProdBase*> prods;
    for (auto p : syntax.prods) {
        switch (p->kind) {
            case SyntaxKind::RsProdItem:
                prods.push_back(
                    comp.emplace<ProdItem>(createProdItem(p->as<RsProdItemSyntax>(), context)));
                break;
            case SyntaxKind::RsCodeBlock: {
                SLANG_ASSERT(blockIt != blockRange.end());
                prods.push_back(comp.emplace<CodeBlockProd>(*blockIt++));
                break;
            }
            case SyntaxKind::RsIfElse: {
                auto& ries = p->as<RsIfElseSyntax>();
                auto& expr = Expression::bind(*ries.condition, context);
                auto ifItem = createProdItem(*ries.ifItem, context);

                std::optional<ProdItem> elseItem;
                if (ries.elseClause)
                    elseItem = createProdItem(*ries.elseClause->item, context);

                if (!expr.bad())
                    context.requireBooleanConvertible(expr);

                prods.push_back(comp.emplace<IfElseProd>(expr, ifItem, elseItem));
                break;
            }
            case SyntaxKind::RsRepeat: {
                auto& rrs = p->as<RsRepeatSyntax>();
                auto& expr = Expression::bind(*rrs.expr, context);
                auto item = createProdItem(*rrs.item, context);
                prods.push_back(comp.emplace<RepeatProd>(expr, item));

                context.requireIntegral(expr);
                break;
            }
            case SyntaxKind::RsCase:
                prods.push_back(&createCaseProd(p->as<RsCaseSyntax>(), context));
                break;
            default:
                SLANG_UNREACHABLE;
        }
    }

    const Expression* weightExpr = nullptr;
    std::optional<CodeBlockProd> codeBlock;
    if (auto wc = syntax.weightClause) {
        weightExpr = &Expression::bind(*wc->weight, context);
        context.requireIntegral(*weightExpr);

        if (wc->codeBlock) {
            SLANG_ASSERT(blockIt != blockRange.end());
            codeBlock = CodeBlockProd(*blockIt++);
        }
    }

    bool isRandJoin = false;
    const Expression* randJoinExpr = nullptr;
    if (syntax.randJoin) {
        isRandJoin = true;
        if (syntax.randJoin->expr) {
            randJoinExpr = &Expression::bind(*syntax.randJoin->expr, context);

            if (!randJoinExpr->bad() && !randJoinExpr->type->isNumeric()) {
                context.addDiag(diag::RandJoinNotNumeric, randJoinExpr->sourceRange)
                    << *randJoinExpr->type;
            }
        }
    }

    for (auto& block : blockRange) {
        Statement::StatementContext stmtCtx(context);
        stmtCtx.flags = StatementFlags::InRandSeq;
        block.getStatement(context, stmtCtx);
    }

    return {ruleBlock, prods.copy(comp), weightExpr, randJoinExpr, codeBlock, isRandJoin};
}